

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::CheckTargetsForType(cmGlobalGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  reference this_01;
  pointer this_02;
  GeneratorTargetVector *this_03;
  pointer pcVar4;
  string *psVar5;
  long lVar6;
  cmake *this_04;
  bool local_1ae;
  undefined1 local_178 [24];
  string local_160;
  undefined1 local_139;
  string local_138;
  _Base_ptr local_118;
  string *config;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  string local_d0;
  string local_b0 [8];
  string systemName;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *generator;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  bool failed;
  allocator<char> local_39;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Swift",&local_39);
  bVar1 = GetLanguageEnabled(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = false;
    __end1 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(&this->LocalGenerators);
    generator = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                std::
                vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ::end(&this->LocalGenerators);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                       *)&generator), this_local._7_1_ = bVar1, bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                ::operator*(&__end1);
      this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                operator->(this_01);
      this_03 = cmLocalGenerator::GetGeneratorTargets(this_02);
      __end2 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(this_03);
      target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
               std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::end(this_03);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                         *)&target), bVar2) {
        systemName.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
             ::operator*(&__end2);
        pcVar4 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)systemName.field_2._8_8_);
        this_00 = pcVar4->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"CMAKE_SYSTEM_NAME",(allocator<char> *)((long)&configs + 7));
        psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_d0);
        std::__cxx11::string::string(local_b0,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&configs + 7));
        lVar6 = std::__cxx11::string::find((char *)local_b0,0xc16532);
        if (lVar6 == -1) {
          configs._0_4_ = 5;
        }
        else {
          pcVar4 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)systemName.field_2._8_8_);
          TVar3 = cmGeneratorTarget::GetType(pcVar4);
          if (TVar3 == EXECUTABLE) {
            pcVar4 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)systemName.field_2._8_8_);
            cmMakefile::GetGeneratorConfigs_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range4,pcVar4->Makefile,IncludeEmptyConfig);
            local_e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range4;
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range4);
            config = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range4);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&config), bVar2) {
              local_118 = (_Base_ptr)
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end4);
              pcVar4 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   *)systemName.field_2._8_8_);
              local_139 = 0;
              bVar2 = cmGeneratorTarget::IsWin32Executable(pcVar4,(string *)local_118);
              local_1ae = false;
              if (bVar2) {
                pcVar4 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                       *)systemName.field_2._8_8_);
                cmGeneratorTarget::GetLinkerLanguage(&local_138,pcVar4,(string *)local_118);
                local_139 = 1;
                local_1ae = std::operator==(&local_138,"Swift");
              }
              if ((local_139 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_138);
              }
              if (local_1ae != false) {
                this_04 = GetCMakeInstance(this);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_160,
                           "WIN32_EXECUTABLE property is not supported on Swift executables",
                           (allocator<char> *)(local_178 + 0x17));
                std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )systemName.field_2._8_8_);
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_178);
                cmake::IssueMessage(this_04,FATAL_ERROR,&local_160,(cmListFileBacktrace *)local_178)
                ;
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_178);
                std::__cxx11::string::~string((string *)&local_160);
                std::allocator<char>::~allocator((allocator<char> *)(local_178 + 0x17));
                bVar1 = true;
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range4);
          }
          configs._0_4_ = 0;
        }
        std::__cxx11::string::~string(local_b0);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForType() const
{
  if (!this->GetLanguageEnabled("Swift")) {
    return false;
  }
  bool failed = false;
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& target : generator->GetGeneratorTargets()) {
      std::string systemName =
        target->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME");
      if (systemName.find("Windows") == std::string::npos) {
        continue;
      }

      if (target->GetType() == cmStateEnums::EXECUTABLE) {
        std::vector<std::string> const& configs =
          target->Makefile->GetGeneratorConfigs(
            cmMakefile::IncludeEmptyConfig);
        for (std::string const& config : configs) {
          if (target->IsWin32Executable(config) &&
              target->GetLinkerLanguage(config) == "Swift") {
            this->GetCMakeInstance()->IssueMessage(
              MessageType::FATAL_ERROR,
              "WIN32_EXECUTABLE property is not supported on Swift "
              "executables",
              target->GetBacktrace());
            failed = true;
          }
        }
      }
    }
  }
  return failed;
}